

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inproc.c
# Opt level: O0

int inproc_ep_bind(void *arg,nng_url *url)

{
  int iVar1;
  nni_list *list;
  inproc_ep *srch;
  inproc_ep *ep;
  nng_url *url_local;
  void *arg_local;
  
  nni_mtx_lock(&nni_inproc.mx);
  list = (nni_list *)nni_list_first(&nni_inproc.servers);
  while( true ) {
    if (list == (nni_list *)0x0) {
      nni_list_append(&nni_inproc.servers,arg);
      nni_mtx_unlock(&nni_inproc.mx);
      return 0;
    }
    iVar1 = strcmp((char *)(list->ll_head).ln_next,*arg);
    if (iVar1 == 0) break;
    list = (nni_list *)nni_list_next(&nni_inproc.servers,list);
  }
  nni_mtx_unlock(&nni_inproc.mx);
  return 10;
}

Assistant:

static int
inproc_ep_bind(void *arg, nng_url *url)
{
	inproc_ep *ep = arg;
	inproc_ep *srch;
	nni_list  *list = &nni_inproc.servers;
	NNI_ARG_UNUSED(url);

	nni_mtx_lock(&nni_inproc.mx);
	NNI_LIST_FOREACH (list, srch) {
		if (strcmp(srch->addr, ep->addr) == 0) {
			nni_mtx_unlock(&nni_inproc.mx);
			return (NNG_EADDRINUSE);
		}
	}
	nni_list_append(list, ep);
	nni_mtx_unlock(&nni_inproc.mx);
	return (0);
}